

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
PDA::Transducer::Generator::writeFunctionBody
          (Generator *this,wostream *stream,size_t startTokenIndex)

{
  int iVar1;
  pointer pTVar2;
  int iVar3;
  int iVar4;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar5;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar6;
  Token *pTVar7;
  long lVar8;
  byte bVar9;
  size_t i;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> local_58;
  wostream *local_38;
  
  local_38 = stream;
  pvVar5 = Tokenizer::tokens(this->m_tokenizer);
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (Token *)0x0;
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Token *)0x0;
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Token *)0x0;
  lVar8 = startTokenIndex * 0x14;
  bVar9 = 0;
  while( true ) {
    pvVar6 = Tokenizer::tokens(this->m_tokenizer);
    if (startTokenIndex ==
        ((long)(pvVar6->
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar6->
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
               _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333) break;
    pTVar2 = (pvVar5->
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)&pTVar2->token + lVar8);
    if ((bool)(~bVar9 & 1 | iVar1 == 0x76)) {
      bVar9 = bVar9 | iVar1 == 0x76;
    }
    else if (iVar1 == 0x3b) {
      if (local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        writeAssembledOperation(this,local_38,&local_58);
        pTVar7 = local_58.
                 super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_58.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_58.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_start) goto LAB_0012f945;
      }
    }
    else {
      if (iVar1 == 0x7d) break;
      pTVar7 = (Token *)((long)&pTVar2->token + lVar8);
      if (local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<PDA::Transducer::Token,std::allocator<PDA::Transducer::Token>>::
        _M_realloc_insert<PDA::Transducer::Token_const&>
                  ((vector<PDA::Transducer::Token,std::allocator<PDA::Transducer::Token>> *)
                   &local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pTVar7);
      }
      else {
        (local_58.
         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl
         .super__Vector_impl_data._M_finish)->identifierIdx = pTVar7->identifierIdx;
        iVar1 = pTVar7->position;
        iVar3 = pTVar7->line;
        iVar4 = pTVar7->fileIndex;
        (local_58.
         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl
         .super__Vector_impl_data._M_finish)->token = pTVar7->token;
        (local_58.
         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl
         .super__Vector_impl_data._M_finish)->position = iVar1;
        (local_58.
         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl
         .super__Vector_impl_data._M_finish)->line = iVar3;
        (local_58.
         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl
         .super__Vector_impl_data._M_finish)->fileIndex = iVar4;
        pTVar7 = local_58.
                 super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
LAB_0012f945:
        local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar7;
      }
    }
    startTokenIndex = startTokenIndex + 1;
    lVar8 = lVar8 + 0x14;
  }
  if (local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    writeAssembledOperation(this,local_38,&local_58);
  }
  if (local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_start != (Token *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::writeFunctionBody(std::wostream &stream, const size_t startTokenIndex)
{
    bool started = false;
    const std::vector<Token> &tokens = m_tokenizer.tokens();
    std::vector<Token> currentOp;
    for(size_t i = startTokenIndex; i != m_tokenizer.tokens().size(); ++i)
    {
        if (tokens[i].token == L'v')
        {
            started = true;
            continue;
        }
        if (!started)
            continue;
        //checking for end
        if (tokens[i].token == L'}')
            break;
        // splitting
        if (tokens[i].token == L';')
        {
            if (!currentOp.empty())
            {
                writeAssembledOperation(stream, currentOp);
                currentOp.clear();
            }
        }
        else
            currentOp.push_back(tokens[i]);
    }
    if (!currentOp.empty())
        writeAssembledOperation(stream, currentOp);
}